

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Expr *p;
  Vdbe *v;
  ExprList *pEVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int p1;
  int iVar5;
  int iVar6;
  uint uVar7;
  byte *p_00;
  int *piVar8;
  CollSeq *pCVar9;
  Expr *pEVar10;
  byte bVar11;
  int *piVar12;
  int *piVar13;
  long lVar14;
  ExprList_item *pEVar15;
  sqlite3 *db;
  int *piVar16;
  uint local_7c;
  uint local_6c;
  int local_54;
  int rRhsHasNull;
  byte *local_48;
  int *local_40;
  int regToFree;
  int iDummy;
  
  rRhsHasNull = 0;
  p = pExpr->pLeft;
  iVar2 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar2 != 0) {
    return;
  }
  p_00 = (byte *)exprINAffinity(pParse,pExpr);
  uVar3 = sqlite3ExprVectorSize(pExpr->pLeft);
  piVar8 = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar3 * 5 + 1);
  db = pParse->db;
  if (db->mallocFailed != '\0') goto LAB_00156885;
  v = pParse->pVdbe;
  piVar12 = (int *)0x0;
  piVar16 = &rRhsHasNull;
  if (destIfFalse == destIfNull) {
    piVar16 = piVar12;
  }
  local_48 = p_00;
  iVar2 = sqlite3FindInIndex(pParse,pExpr,3,piVar16,piVar8);
  pParse->iCacheLevel = pParse->iCacheLevel + 1;
  iVar4 = exprCodeVector(pParse,p,&iDummy);
  piVar16 = (int *)0x0;
  if (0 < (int)uVar3) {
    piVar16 = (int *)(ulong)uVar3;
  }
  for (; (piVar13 = piVar16, piVar16 != piVar12 &&
         (piVar13 = piVar12, piVar12 == (int *)(ulong)(uint)piVar8[(long)piVar12]));
      piVar12 = (int *)((long)piVar12 + 1)) {
  }
  local_40 = piVar8;
  p1 = iVar4;
  if ((uint)piVar13 != uVar3) {
    p1 = sqlite3GetTempRange(pParse,uVar3);
    for (piVar8 = (int *)0x0; piVar16 != piVar8; piVar8 = (int *)((long)piVar8 + 1)) {
      sqlite3VdbeAddOp3(v,0x40,iVar4 + (int)piVar8,local_40[(long)piVar8] + p1,0);
    }
  }
  if (iVar2 == 5) {
    pEVar1 = (pExpr->x).pList;
    pCVar9 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
    uVar3 = sqlite3VdbeMakeLabel(v);
    iVar2 = 0;
    if (destIfFalse != destIfNull) {
      iVar2 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v,0x54,p1,p1,iVar2);
    }
    pEVar15 = pEVar1->a;
    for (lVar14 = 0; lVar14 < pEVar1->nExpr; lVar14 = lVar14 + 1) {
      iVar5 = sqlite3ExprCodeTemp(pParse,pEVar15->pExpr,&regToFree);
      if ((iVar2 != 0) && (iVar6 = sqlite3ExprCanBeNull(pEVar15->pExpr), iVar6 != 0)) {
        sqlite3VdbeAddOp3(v,0x54,iVar2,iVar5,iVar2);
      }
      if ((destIfFalse == destIfNull) && ((long)pEVar1->nExpr + -1 <= lVar14)) {
        sqlite3VdbeAddOp4(v,0x4d,p1,destIfFalse,iVar5,(char *)pCVar9,-2);
        uVar7 = v->nOp;
        if (0 < (int)uVar7) {
          bVar11 = *local_48 | 0x10;
LAB_00156540:
          v->aOp[(ulong)uVar7 - 1].p5 = (short)(char)bVar11;
        }
      }
      else {
        sqlite3VdbeAddOp4(v,0x4e,p1,uVar3,iVar5,(char *)pCVar9,-2);
        uVar7 = v->nOp;
        if (0 < (int)uVar7) {
          bVar11 = *local_48;
          goto LAB_00156540;
        }
      }
      sqlite3ReleaseTempReg(pParse,regToFree);
      pEVar15 = pEVar15 + 1;
    }
    if (iVar2 != 0) {
      sqlite3VdbeAddOp2(v,0x4b,iVar2,destIfNull);
      sqlite3VdbeGoto(v,destIfFalse);
    }
    piVar8 = local_40;
    piVar16 = v->pParse->aLabel;
    if (piVar16 != (int *)0x0) {
      piVar16[(int)~uVar3] = v->nOp;
    }
    sqlite3ReleaseTempReg(pParse,iVar2);
  }
  else {
    iVar5 = 0;
    local_6c = 0;
    uVar7 = destIfFalse;
    if (destIfFalse != destIfNull) {
      uVar7 = sqlite3VdbeMakeLabel(v);
      local_6c = uVar7;
    }
    for (; (int)piVar16 != iVar5; iVar5 = iVar5 + 1) {
      pEVar10 = sqlite3VectorFieldSubexpr(pExpr->pLeft,iVar5);
      iVar6 = sqlite3ExprCanBeNull(pEVar10);
      if (iVar6 != 0) {
        sqlite3VdbeAddOp2(v,0x4b,p1 + iVar5,uVar7);
      }
    }
    if (iVar2 == 1) {
      sqlite3VdbeAddOp3(v,0x1f,pExpr->iTable,destIfFalse,p1);
      local_54 = sqlite3VdbeAddOp0(v,0xd);
    }
    else {
      sqlite3VdbeAddOp4(v,0x62,p1,uVar3,0,(char *)local_48,uVar3);
      piVar8 = local_40;
      if (destIfFalse == destIfNull) {
        sqlite3VdbeAddOp4Int(v,0x1d,pExpr->iTable,destIfFalse,p1,uVar3);
        goto LAB_00156865;
      }
      local_54 = sqlite3VdbeAddOp4Int(v,0x1e,pExpr->iTable,0,p1,uVar3);
    }
    if (uVar3 == 1 && rRhsHasNull != 0) {
      sqlite3VdbeAddOp2(v,0x4c,rRhsHasNull,destIfFalse);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeGoto(v,destIfFalse);
    }
    if ((local_6c != 0) && (piVar8 = v->pParse->aLabel, piVar8 != (int *)0x0)) {
      piVar8[(int)~local_6c] = v->nOp;
    }
    iVar2 = sqlite3VdbeAddOp2(v,0x25,pExpr->iTable,destIfFalse);
    local_7c = destIfFalse;
    if (1 < (int)uVar3) {
      local_7c = sqlite3VdbeMakeLabel(v);
    }
    for (iVar5 = 0; (int)piVar16 != iVar5; iVar5 = iVar5 + 1) {
      iVar6 = sqlite3GetTempReg(pParse);
      pEVar10 = sqlite3VectorFieldSubexpr(p,iVar5);
      pCVar9 = sqlite3ExprCollSeq(pParse,pEVar10);
      sqlite3VdbeAddOp3(v,0x60,pExpr->iTable,iVar5,iVar6);
      sqlite3VdbeAddOp4(v,0x4d,p1 + iVar5,local_7c,iVar6,(char *)pCVar9,-2);
      sqlite3ReleaseTempReg(pParse,iVar6);
    }
    sqlite3VdbeAddOp2(v,0xd,0,destIfNull);
    piVar8 = local_40;
    if (1 < (int)uVar3) {
      piVar16 = v->pParse->aLabel;
      if (piVar16 != (int *)0x0) {
        piVar16[(int)~local_7c] = v->nOp;
      }
      sqlite3VdbeAddOp2(v,7,pExpr->iTable,iVar2 + 1);
      sqlite3VdbeAddOp2(v,0xd,0,destIfFalse);
    }
    sqlite3VdbeJumpHere(v,local_54);
  }
LAB_00156865:
  if (p1 != iVar4) {
    sqlite3ReleaseTempReg(pParse,p1);
  }
  sqlite3ExprCachePop(pParse);
  db = pParse->db;
  p_00 = local_48;
LAB_00156885:
  sqlite3DbFree(db,piVar8);
  sqlite3DbFree(pParse->db,p_00);
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */ 

  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened ith cursor pExpr->iTable 
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull, aiMap);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC 
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a 
  ** vector, then it is stored in an array of nVector registers starting 
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  */
  sqlite3ExprCachePush(pParse);
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList = pExpr->x.pList;
    CollSeq *pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    int labelOk = sqlite3VdbeMakeLabel(v);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        sqlite3VdbeAddOp4(v, OP_Eq, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1);
        VdbeCoverageIf(v, ii==pList->nExpr-1);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, OP_Ne, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(v);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, pExpr->iTable, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, pExpr->iTable, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, pExpr->iTable, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false. 
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, pExpr->iTable, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(v);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, pExpr->iTable, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, pExpr->iTable, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  sqlite3ExprCachePop(pParse);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}